

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_UTF8.h
# Opt level: O1

char * choc::text::findInvalidUTF8Data(void *dataToCheck,size_t numBytes)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  
  if (dataToCheck == (void *)0x0) {
    soul::throwInternalCompilerError("dataToCheck != nullptr","findInvalidUTF8Data",0xc4);
  }
  if (numBytes != 0) {
    uVar4 = 0;
    do {
      bVar1 = *(byte *)((long)dataToCheck + uVar4);
      if ((char)bVar1 < '\x01') {
        uVar7 = (uint)bVar1;
        if (uVar7 == 0) {
          lVar10 = 1;
          goto LAB_001c0fdb;
        }
        iVar6 = 0;
        if ((bVar1 & 0x40) == 0) goto LAB_001c0fa4;
        uVar5 = 0x40;
        uVar11 = 0;
        goto LAB_001c0eef;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < numBytes);
  }
  return (char *)0x0;
LAB_001c0eef:
  do {
    if ((2 < uVar11) || (numBytes <= uVar4 + uVar11 + 1)) goto LAB_001c0fa4;
    uVar11 = uVar11 + 1;
    if (uVar11 == 3) {
      uVar12 = uVar7;
      if ((char)bVar1 < '\0') {
        if ((bVar1 & 0x40) == 0) {
          iVar8 = 0;
          uVar12 = 0x7f;
        }
        else {
          uVar12 = 0x7f;
          iVar8 = 0;
          uVar9 = 0x40;
          do {
            uVar12 = uVar12 >> 1;
            iVar8 = iVar8 + 1;
            if (uVar9 < 0x12) break;
            uVar9 = uVar9 >> 1;
          } while ((uVar9 & uVar7) != 0);
        }
        uVar12 = uVar12 & bVar1;
        if (iVar8 != 0) {
          lVar10 = 0;
          do {
            bVar2 = *(byte *)((long)dataToCheck + lVar10 + uVar4 + 1);
            if ((bVar2 & 0xc0) != 0x80) {
              soul::throwInternalCompilerError("(nextByte & 0xc0) == 0x80","popFirstChar",0x149);
            }
            uVar12 = uVar12 << 6 | bVar2 & 0x3f;
            lVar10 = lVar10 + 1;
          } while (iVar8 != (int)lVar10);
        }
      }
      if (0x10ffff < uVar12) goto LAB_001c0fa4;
    }
    uVar5 = uVar5 >> 1;
  } while ((uVar5 & bVar1) != 0);
  iVar6 = (int)uVar11;
LAB_001c0fa4:
  if (iVar6 == 0) {
    lVar10 = 2;
  }
  else {
    lVar10 = 0;
  }
LAB_001c0fdb:
  pcVar3 = (char *)(*(code *)((long)&DAT_00260120 + (long)(int)(&DAT_00260120)[lVar10]))();
  return pcVar3;
}

Assistant:

inline const char* findInvalidUTF8Data (const void* dataToCheck, size_t numBytes)
{
    CHOC_ASSERT (dataToCheck != nullptr);
    auto source = static_cast<const char*> (dataToCheck);
    size_t offset = 0;

    for (;;)
    {
        if (offset >= numBytes)
            return nullptr;

        auto byte = static_cast<signed char> (source[offset]);

        if (byte > 0)
        {
            ++offset;
            continue;
        }

        if (byte == 0)
            return nullptr;

        int testBit = 0x40, numExtraBytes = 0;

        while ((byte & testBit) != 0)
        {
            testBit >>= 1;
            ++numExtraBytes;

            if (numExtraBytes > 3
                || offset + static_cast<size_t> (numExtraBytes) >= numBytes
                || (numExtraBytes == 3 && *UTF8Pointer (source + offset) > 0x10ffff))
            {
                numExtraBytes = 0;
                break;
            }
        }

        if (numExtraBytes == 0)
            break;

        ++offset;

        for (int i = 0; i < numExtraBytes; ++i)
            if ((source[offset++] & 0xc0) != 0x80)
                break;
    }

    return source + offset;
}